

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O1

DdNode * Cudd_addGeneralVectorCompose(DdManager *dd,DdNode *f,DdNode **vectorOn,DdNode **vectorOff)

{
  int *piVar1;
  DdHalfWord DVar2;
  DdNode *pDVar3;
  uint uVar4;
  DdHashTable *table;
  DdNode *pDVar5;
  uint uVar6;
  uint uVar7;
  uint deepest;
  
  do {
    dd->reordered = 0;
    table = cuddHashTableInit(dd,1,2);
    if (table == (DdHashTable *)0x0) {
      return (DdNode *)0x0;
    }
    uVar6 = dd->size;
    uVar4 = (int)uVar6 >> 0x1f & uVar6;
    uVar7 = uVar6;
    do {
      uVar6 = uVar6 - 1;
      deepest = uVar4 - 1;
      if ((int)uVar7 < 1) break;
      DVar2 = dd->invperm[uVar6];
      pDVar5 = vectorOn[(int)DVar2];
      if ((((pDVar5->index != DVar2) || (pDVar3 = vectorOff[(int)DVar2], pDVar3->index != DVar2)) ||
          ((pDVar5->type).kids.T != dd->one)) ||
         (((pDVar5->type).kids.E != dd->zero || ((pDVar3->type).kids.T != dd->zero)))) {
        deepest = uVar7 - 1;
        break;
      }
      deepest = uVar7 - 1;
      uVar7 = deepest;
    } while ((pDVar3->type).kids.E == dd->one);
    pDVar5 = cuddAddGeneralVectorComposeRecur(dd,table,f,vectorOn,vectorOff,deepest);
    if (pDVar5 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
    }
    cuddHashTableQuit(table);
    if (dd->reordered != 1) {
      if (pDVar5 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
      }
      return pDVar5;
    }
  } while( true );
}

Assistant:

DdNode *
Cudd_addGeneralVectorCompose(
  DdManager * dd,
  DdNode * f,
  DdNode ** vectorOn,
  DdNode ** vectorOff)
{
    DdHashTable         *table;
    DdNode              *res;
    int                 deepest;
    int                 i;

    do {
        dd->reordered = 0;
        /* Initialize local cache. */
        table = cuddHashTableInit(dd,1,2);
        if (table == NULL) return(NULL);

        /* Find deepest real substitution. */
        for (deepest = dd->size - 1; deepest >= 0; deepest--) {
            i = dd->invperm[deepest];
            if (!ddIsIthAddVarPair(dd,vectorOn[i],vectorOff[i],i)) {
                break;
            }
        }

        /* Recursively solve the problem. */
        res = cuddAddGeneralVectorComposeRecur(dd,table,f,vectorOn,
                                               vectorOff,deepest);
        if (res != NULL) cuddRef(res);

        /* Dispose of local cache. */
        cuddHashTableQuit(table);
    } while (dd->reordered == 1);

    if (res != NULL) cuddDeref(res);
    return(res);

}